

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int wally_elements_pegout_script_from_bytes
              (uchar *genesis_blockhash,size_t genesis_blockhash_len,uchar *mainchain_script,
              size_t mainchain_script_len,uchar *sub_pubkey,size_t sub_pubkey_len,
              uchar *whitelistproof,size_t whitelistproof_len,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  int iVar1;
  ulong uVar2;
  ulong len_00;
  uchar *puVar3;
  size_t bytes_written;
  size_t local_38;
  
  local_38 = 1;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if ((len != 0 && bytes_out != (uchar *)0x0) &&
      ((flags == 0 && whitelistproof_len != 0) &&
      (whitelistproof != (uchar *)0x0 &&
      ((sub_pubkey_len == 0x21 && sub_pubkey != (uchar *)0x0) &&
      ((mainchain_script_len != 0 && genesis_blockhash_len == 0x20) &&
      (mainchain_script != (uchar *)0x0 && genesis_blockhash != (uchar *)0x0)))))) {
    *bytes_out = 'j';
    if (written != (size_t *)0x0) {
      *written = *written + 1;
    }
    puVar3 = bytes_out + 1;
    uVar2 = len - 1;
    iVar1 = wally_script_push_from_bytes
                      (genesis_blockhash,genesis_blockhash_len,0,puVar3,uVar2,&local_38);
    if (iVar1 == 0) {
      if (written != (size_t *)0x0) {
        *written = *written + local_38;
      }
      len_00 = uVar2 - local_38;
      if (local_38 <= uVar2) {
        puVar3 = puVar3 + local_38;
        iVar1 = wally_script_push_from_bytes
                          (mainchain_script,mainchain_script_len,0,puVar3,len_00,&local_38);
        if (iVar1 != 0) {
          return iVar1;
        }
        if (written != (size_t *)0x0) {
          *written = *written + local_38;
        }
        uVar2 = len_00 - local_38;
        if (local_38 <= len_00) {
          puVar3 = puVar3 + local_38;
          iVar1 = wally_script_push_from_bytes(sub_pubkey,sub_pubkey_len,0,puVar3,uVar2,&local_38);
          if (iVar1 != 0) {
            return iVar1;
          }
          if (written != (size_t *)0x0) {
            *written = *written + local_38;
          }
          if (local_38 <= uVar2) {
            iVar1 = wally_script_push_from_bytes
                              (whitelistproof,whitelistproof_len,0,puVar3 + local_38,
                               uVar2 - local_38,&local_38);
            if (written == (size_t *)0x0) {
              return iVar1;
            }
            if (iVar1 != 0) {
              return iVar1;
            }
            *written = *written + local_38;
          }
        }
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_elements_pegout_script_from_bytes(const unsigned char *genesis_blockhash,
                                            size_t genesis_blockhash_len,
                                            const unsigned char *mainchain_script,
                                            size_t mainchain_script_len,
                                            const unsigned char *sub_pubkey,
                                            size_t sub_pubkey_len,
                                            const unsigned char *whitelistproof,
                                            size_t whitelistproof_len,
                                            uint32_t flags,
                                            unsigned char *bytes_out,
                                            size_t len,
                                            size_t *written)
{
#define pegout_script_push(bytes, bytes_len) \
    if (len < bytes_written) \
        return WALLY_OK; \
    bytes_out += bytes_written; \
    len -= bytes_written; \
    if ((ret = wally_script_push_from_bytes(bytes, bytes_len, 0, bytes_out, len, &bytes_written)) != WALLY_OK) \
        return ret; \
    if (written) \
        *written += bytes_written;

    size_t bytes_written = 1; /* OP_RETURN */
    int ret;

    if (written)
        *written = 0;

    if (!genesis_blockhash || genesis_blockhash_len != SHA256_LEN ||
        !mainchain_script || !mainchain_script_len || !sub_pubkey || sub_pubkey_len != EC_PUBLIC_KEY_LEN ||
        !whitelistproof || !whitelistproof_len || flags || !bytes_out || !len)
        return WALLY_EINVAL;

    *bytes_out = OP_RETURN;
    if (written)
        *written += bytes_written;

    pegout_script_push(genesis_blockhash, genesis_blockhash_len);
    pegout_script_push(mainchain_script, mainchain_script_len);
    pegout_script_push(sub_pubkey, sub_pubkey_len);
    pegout_script_push(whitelistproof, whitelistproof_len);

    return WALLY_OK;

#undef pegout_script_push
}